

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayObject.cpp
# Opt level: O0

void __thiscall Js::ArrayObject::ThrowItemNotConfigurableError(ArrayObject *this,PropertyId propId)

{
  ScriptContext *this_00;
  ThreadContext *this_01;
  PropertyRecord *this_02;
  undefined8 local_30;
  ScriptContext *scriptContext;
  PropertyId propId_local;
  ArrayObject *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  if (propId == -1) {
    local_30 = (PCWSTR)0x0;
  }
  else {
    this_01 = ScriptContext::GetThreadContext(this_00);
    this_02 = ThreadContext::GetPropertyName(this_01,propId);
    local_30 = PropertyRecord::GetBuffer(this_02);
  }
  JavascriptError::ThrowTypeError(this_00,-0x7ff5ec2a,local_30);
}

Assistant:

void ArrayObject::ThrowItemNotConfigurableError(PropertyId propId /*= Constants::NoProperty*/)
    {
        ScriptContext* scriptContext = GetScriptContext();
        JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable,
            propId != Constants::NoProperty ?
                scriptContext->GetThreadContext()->GetPropertyName(propId)->GetBuffer() : nullptr);
    }